

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O2

int Saig_ManExtendOneEval2(Vec_Ptr_t *vSimInfo,Aig_Obj_t *pObj,int iFrame)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint Value;
  
  uVar1 = Saig_ManSimInfo2Get(vSimInfo,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),
                              iFrame);
  if (((ulong)pObj->pFanin0 & 1) != 0) {
    uVar1 = *(uint *)(&DAT_007cb690 + (ulong)uVar1 * 4);
  }
  uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
  Value = uVar1;
  if ((uVar2 & 7) != 3) {
    if ((uVar2 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                    ,0xe0,"int Saig_ManExtendOneEval2(Vec_Ptr_t *, Aig_Obj_t *, int)");
    }
    uVar2 = Saig_ManSimInfo2Get(vSimInfo,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),
                                iFrame);
    if (((ulong)pObj->pFanin1 & 1) != 0) {
      iVar3 = (*(code *)(&DAT_007cb260 + *(int *)(&DAT_007cb260 + (ulong)uVar2 * 4)))();
      return iVar3;
    }
    Value = 0;
    if ((uVar1 != 0) && (uVar2 != 0)) {
      if ((uVar1 != 1) || (uVar2 != 1)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                      ,0x6c,"int Saig_ManSimInfo2And(int, int)");
      }
      Value = 1;
    }
  }
  Saig_ManSimInfo2Set(vSimInfo,pObj,iFrame,Value);
  return Value;
}

Assistant:

int Saig_ManExtendOneEval2( Vec_Ptr_t * vSimInfo, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value0 = Saig_ManSimInfo2Get( vSimInfo, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Saig_ManSimInfo2Not( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManSimInfo2Set( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    Value1 = Saig_ManSimInfo2Get( vSimInfo, Aig_ObjFanin1(pObj), iFrame );
    if ( Aig_ObjFaninC1(pObj) )
        Value1 = Saig_ManSimInfo2Not( Value1 );
    Value = Saig_ManSimInfo2And( Value0, Value1 );
    Saig_ManSimInfo2Set( vSimInfo, pObj, iFrame, Value );
    return Value;
}